

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# non_recursive_quick_sort.c
# Opt level: O1

void quick_sort(int *arr,int n)

{
  int l;
  int iVar1;
  int r;
  uint uVar2;
  uint uVar3;
  int low [30];
  int high [30];
  int local_128 [32];
  int local_a8 [32];
  
  local_128[0] = 0;
  local_a8[0] = n + -1;
  uVar3 = 1;
  do {
    uVar2 = uVar3 - 1;
    l = local_128[uVar2];
    r = local_a8[uVar2];
    if (l < r) {
      iVar1 = partition(arr,l,r);
      if (iVar1 - l < r - iVar1) {
        local_128[uVar2] = iVar1 + 1;
        local_128[uVar3] = l;
        r = iVar1 + -1;
      }
      else {
        local_a8[uVar2] = iVar1 + -1;
        local_128[uVar3] = iVar1 + 1;
      }
      local_a8[uVar3] = r;
      uVar2 = uVar3 + 1;
    }
    uVar3 = uVar2;
  } while (0 < (int)uVar3);
  return;
}

Assistant:

void quick_sort(int arr[], int n) {
  int sp = 1;
  int low[30], high[30];

  low[0] = 0;
  high[0] = n - 1;

  while (sp > 0) {
    sp--;
    int l = low[sp];
    int r = high[sp];

    if (l >= r)
      ;
    else {
      int v = partition(arr, l, r);
      if (v - l < r - v) {
        low[sp] = v + 1;
        high[sp] = r;
        sp++;
        low[sp] = l;
        high[sp] = v - 1;
        sp++;
      } else {
        low[sp] = l;
        high[sp] = v - 1;
        sp++;
        low[sp] = v + 1;
        high[sp] = r;
        sp++;
      }
    }
  }
}